

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  bool bVar3;
  char *__end;
  bool index_file;
  bool skipheader;
  string local_70;
  string local_50;
  
  skipheader = false;
  index_file = false;
  bVar1 = false;
  while( true ) {
    while( true ) {
      do {
        bVar3 = bVar1;
        iVar2 = getopt(argc,argv,"vhsiz");
        bVar1 = true;
      } while (iVar2 == 0x7a);
      if (0x72 < iVar2) break;
      if (iVar2 == -1) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
        initstreams(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar3) {
          doitz(skipheader);
        }
        else {
          doit(skipheader,index_file);
        }
        return 0;
      }
      if (iVar2 != 0x69) goto LAB_00101766;
      index_file = true;
      bVar1 = bVar3;
    }
    if (iVar2 != 0x73) break;
    skipheader = true;
    bVar1 = bVar3;
  }
  if (iVar2 == 0x76) {
    main_cold_1();
  }
LAB_00101766:
  main_cold_2();
  if (local_70._M_dataplus._M_p != (pointer)(ulong)(uint)argc) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50._M_dataplus._M_p != "vhsiz") {
    operator_delete(local_50._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	bool skipheader = false;
	bool index_file = false;
	bool zip = false;
	while ((opt = getopt(argc, argv, "vhsiz")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'i':
			index_file = true;
			break;
		case 'z':
			zip = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	initstreams();
	if (zip) {
		doitz(skipheader);   // index file always present
	} else {
		doit(skipheader, index_file);
	}
	return EXIT_SUCCESS;
}